

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptConstFoldBinary
          (GlobOpt *this,Instr **pInstr,IntConstantBounds *src1IntConstantBounds,
          IntConstantBounds *src2IntConstantBounds,Value **pDstVal)

{
  Opnd *this_00;
  StackSym *this_01;
  Instr *instr;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  IntConstOpnd *newSrc;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  Value *pVVar5;
  IntConstType src2Const;
  IntConstType IVar6;
  ulong local_40;
  IntConstType tmpValueOut;
  
  bVar2 = DoConstFold(this);
  if (bVar2) {
    if ((*pInstr)->m_kind == InstrKindBranch) {
      src2Const = -1;
      IVar6 = src2Const;
    }
    else {
      IVar6 = (IntConstType)src1IntConstantBounds->lowerBound;
      if (src1IntConstantBounds->lowerBound != src1IntConstantBounds->upperBound) {
        return false;
      }
      src2Const = (IntConstType)src2IntConstantBounds->lowerBound;
      if (src2IntConstantBounds->lowerBound != src2IntConstantBounds->upperBound) {
        return false;
      }
    }
    bVar2 = IR::Instr::BinaryCalculator(*pInstr,IVar6,src2Const,(IntConstType *)&local_40,TyInt32);
    if ((bVar2) && ((long)(int)local_40 == local_40)) {
      CaptureByteCodeSymUses(this,*pInstr);
      newSrc = IR::IntConstOpnd::New(local_40,TyInt32,(*pInstr)->m_func,false);
      IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
      IR::Instr::FreeSrc2(*pInstr);
      OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
      this_00 = (*pInstr)->m_dst;
      bVar2 = IR::Opnd::IsRegOpnd(this_00);
      tmpValueOut = (IntConstType)this_00;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3118,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pRVar4 = IR::Opnd::AsRegOpnd((Opnd *)tmpValueOut);
      this_01 = pRVar4->m_sym;
      if (((this_01->field_0x18 & 1) != 0) && ((this_01->field_5).m_instrDef != (Instr *)0x0)) {
        StackSym::SetIsIntConst(this_01,local_40);
      }
      sourceContextId = Func::GetSourceContextId(this->func);
      functionId = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,sourceContextId,functionId)
      ;
      IVar6 = tmpValueOut;
      if (bVar2) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Constant folding to %d: \n",local_40 & 0xffffffff);
        IR::Instr::Dump(*pInstr);
        Output::Flush();
      }
      pVVar5 = GetIntConstantValue(this,(int)local_40,*pInstr,(Opnd *)IVar6);
      *pDstVal = pVVar5;
      bVar2 = IsTypeSpecPhaseOff(this->func);
      instr = *pInstr;
      if (bVar2) {
        instr->m_opcode = LdC_A_I4;
        pRVar4 = IR::Opnd::AsRegOpnd((Opnd *)IVar6);
        ToVarRegOpnd(this,pRVar4,this->currentBlock);
      }
      else {
        instr->m_opcode = Ld_I4;
        pRVar4 = IR::Opnd::AsRegOpnd((Opnd *)IVar6);
        ToInt32Dst(this,instr,pRVar4,this->currentBlock);
      }
      InvalidateInductionVariables(this,*pInstr);
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptConstFoldBinary(
    IR::Instr * *pInstr,
    const IntConstantBounds &src1IntConstantBounds,
    const IntConstantBounds &src2IntConstantBounds,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value;
    IR::IntConstOpnd *constOpnd;

    if (!DoConstFold())
    {
        return false;
    }

    int32 src1IntConstantValue = -1;
    int32 src2IntConstantValue = -1;

    int32 src1MaxIntConstantValue = -1;
    int32 src2MaxIntConstantValue = -1;
    int32 src1MinIntConstantValue = -1;
    int32 src2MinIntConstantValue = -1;

    if (instr->IsBranchInstr())
    {
        src1MinIntConstantValue = src1IntConstantBounds.LowerBound();
        src1MaxIntConstantValue = src1IntConstantBounds.UpperBound();
        src2MinIntConstantValue = src2IntConstantBounds.LowerBound();
        src2MaxIntConstantValue = src2IntConstantBounds.UpperBound();
    }
    else if (src1IntConstantBounds.IsConstant() && src2IntConstantBounds.IsConstant())
    {
        src1IntConstantValue = src1IntConstantBounds.LowerBound();
        src2IntConstantValue = src2IntConstantBounds.LowerBound();
    }
    else
    {
        return false;
    }

    IntConstType tmpValueOut;
    if (!instr->BinaryCalculator(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, TyInt32)
        || !Math::FitsInDWord(tmpValueOut))
    {
        return false;
    }

    value = (int32)tmpValueOut;

    this->CaptureByteCodeSymUses(instr);
    constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
    instr->ReplaceSrc1(constOpnd);
    instr->FreeSrc2();

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (dstSym->IsSingleDef())
    {
        dstSym->SetIsIntConst(value);
    }

    GOPT_TRACE_INSTR(instr, _u("Constant folding to %d: \n"), value);

    *pDstVal = GetIntConstantValue(value, instr, dst);

    if (IsTypeSpecPhaseOff(this->func))
    {
        instr->m_opcode = Js::OpCode::LdC_A_I4;
        this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
    }
    else
    {
        instr->m_opcode = Js::OpCode::Ld_I4;
        this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    }

    InvalidateInductionVariables(instr);

    return true;
}